

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O2

int __thiscall libsgp4::DateTime::DayOfYear(DateTime *this,int year,int month,int day)

{
  bool bVar1;
  undefined1 *puVar2;
  
  bVar1 = IsValidYearMonthDay(year,month,day);
  if (bVar1) {
    bVar1 = IsLeapYear(year);
    puVar2 = (anonymous_namespace)::cumulDaysInMonth;
    if (bVar1) {
      puVar2 = (undefined1 *)0x10a3c4;
    }
    return day + *(int *)(puVar2 + (long)month * 4);
  }
  __assert_fail("false && \"Invalid year, month and day\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dnwrnr[P]sgp4/libsgp4/DateTime.h"
                ,0x123,"int libsgp4::DateTime::DayOfYear(int, int, int) const");
}

Assistant:

int DayOfYear(int year, int month, int day) const
    {
        if (!IsValidYearMonthDay(year, month, day))
        {
            assert(false && "Invalid year, month and day");
        }

        int daysThisYear = day;

        if (IsLeapYear(year))
        {
            daysThisYear += cumulDaysInMonth[1][month];
        }
        else
        {
            daysThisYear += cumulDaysInMonth[0][month];
        }

        return daysThisYear;
    }